

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext *ctx,uint depth)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (depth != 0) {
    uVar1 = (ctx->loopInfo).count;
    uVar2 = 0;
    uVar3 = uVar1;
    while (uVar3 = uVar3 - 1, uVar3 < uVar1) {
      if ((ctx->loopInfo).data[uVar3].continueBlock != (LLVMBasicBlockRef)0x0) {
        uVar2 = uVar2 + 1;
        if (uVar2 == depth) {
          return (ctx->loopInfo).data[uVar3].continueBlock;
        }
      }
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<LlvmCompilationContext::LoopInfo, 32>::operator[](unsigned int) [T = LlvmCompilationContext::LoopInfo, N = 32]"
               );
}

Assistant:

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext &ctx, unsigned depth)
{
	unsigned pos = ctx.loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!ctx.loopInfo[pos].continueBlock)
			pos--;
	}

	return ctx.loopInfo[pos].continueBlock;
}